

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmilankoviccalendar.cpp
# Opt level: O0

YearMonthDay __thiscall QMilankovicCalendar::julianDayToDate(QMilankovicCalendar *this,qint64 jd)

{
  longlong lVar1;
  long in_RSI;
  long in_FS_OFFSET;
  R_conflict15 RVar2;
  R_conflict15 RVar3;
  R_conflict20 RVar4;
  YearMonthDay YVar5;
  int y;
  R_conflict20 ymd;
  R_conflict15 year100Day;
  R_conflict15 century9Day;
  undefined4 in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff74;
  undefined8 in_stack_ffffffffffffff78;
  int dayInYear;
  int local_80;
  int local_50;
  int local_48;
  int iStack_44;
  YearMonthDay local_14;
  long local_8;
  
  dayInYear = (int)((ulong)in_stack_ffffffffffffff78 >> 0x20);
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  RVar2 = QRoundingDown::qDivMod<328718U,_long_long,_true>(in_RSI * 9 + -0xec5c1e);
  lVar1 = QRoundingDown::qDiv<9u,long_long>
                    (CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70));
  RVar3 = QRoundingDown::qDivMod<36525U,_long_long,_true>(lVar1 * 100 + 99);
  QRoundingDown::qDiv<100u,long_long>(CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70))
  ;
  RVar4 = QRomanCalendrical::dayInYearToYmd(dayInYear);
  local_50 = RVar4.day;
  local_48 = RVar4.year;
  local_80 = (int)RVar2.quotient * 100 + (int)RVar3.quotient + local_48;
  if (local_80 < 1) {
    local_80 = local_80 + -1;
  }
  iStack_44 = RVar4.month;
  QCalendar::YearMonthDay::YearMonthDay(&local_14,local_80,iStack_44,local_50);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  YVar5.day = local_14.day;
  YVar5.year = local_14.year;
  YVar5.month = local_14.month;
  return YVar5;
}

Assistant:

QCalendar::YearMonthDay  QMilankovicCalendar::julianDayToDate(qint64 jd) const
{
    const auto century9Day = qDivMod<NineCenturies>(9 * (jd - MilankovicBaseJd) - 7);
    // Its remainder changes by 9 per day, except roughly once per century.
    const auto year100Day = qDivMod<LeapCentury>(100 * qDiv<9>(century9Day.remainder) + 99);
    // Its remainder changes by 100 per day, except roughly once per year.
    const auto ymd = dayInYearToYmd(qDiv<100>(year100Day.remainder));
    const int y = 100 * century9Day.quotient + year100Day.quotient + ymd.year;
    return QCalendar::YearMonthDay(y > 0 ? y : y - 1, ymd.month, ymd.day);
}